

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time.cc
# Opt level: O1

Time absl::lts_20250127::FromUniversal(int64_t universal)

{
  Duration DVar1;
  Duration *pDVar2;
  long lVar3;
  Duration local_18;
  
  lVar3 = universal % 1000000000;
  local_18.rep_hi_ = (HiRep)((lVar3 >> 0x3d) + universal / 1000000000);
  local_18.rep_lo_ = (int)lVar3 * 4 + 4000000000;
  if (-1 < lVar3) {
    local_18.rep_lo_ = (int)lVar3 * 4;
  }
  pDVar2 = Duration::operator*=(&local_18,100);
  local_18.rep_hi_.lo_ = 0x886e0900;
  local_18.rep_hi_.hi_ = 0xfffffff1;
  local_18.rep_lo_ = 0;
  Duration::operator+=(&local_18,*pDVar2);
  DVar1.rep_lo_ = local_18.rep_lo_;
  DVar1.rep_hi_ = local_18.rep_hi_;
  return (Time)DVar1;
}

Assistant:

absl::Time FromUniversal(int64_t universal) {
  return absl::UniversalEpoch() + 100 * absl::Nanoseconds(universal);
}